

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
          (RepeatedMessageFieldGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  Descriptor *descriptor_00;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  RepeatedMessageFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,descriptor,options);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedMessageFieldGenerator_008e7720;
  bVar1 = IsImplicitWeakField(descriptor,options,scc_analyzer);
  this->implicit_weak_field_ = bVar1;
  descriptor_00 = FieldDescriptor::message_type(descriptor);
  bVar1 = MessageSCCAnalyzer::HasRequiredFields(scc_analyzer,descriptor_00);
  this->has_required_fields_ = bVar1;
  anon_unknown_5::SetMessageVariables
            (descriptor,options,(bool)(this->implicit_weak_field_ & 1),
             &(this->super_FieldGenerator).variables_);
  return;
}

Assistant:

RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options,
    MessageSCCAnalyzer* scc_analyzer)
    : FieldGenerator(descriptor, options),
      implicit_weak_field_(
          IsImplicitWeakField(descriptor, options, scc_analyzer)),
      has_required_fields_(
          scc_analyzer->HasRequiredFields(descriptor->message_type())) {
  SetMessageVariables(descriptor, options, implicit_weak_field_, &variables_);
}